

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::DoesNotMatch(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,Ch *str,SizeType length)

{
  SizeType length_00;
  Ch *s;
  StringRefType *rhs;
  CrtAllocator *pCVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_40;
  GenericStringRef<char> local_30;
  SizeType local_1c;
  Ch *pCStack_18;
  SizeType length_local;
  Ch *str_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_1c = length;
  pCStack_18 = str;
  str_local = (Ch *)this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetObject(&this->currentError_);
  rhs = GetActualString();
  GenericStringRef<char>::GenericStringRef(&local_30,rhs);
  s = pCStack_18;
  length_00 = local_1c;
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_40,s,length_00,pCVar1);
  value = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_40);
  pCVar1 = GetStateAllocator(this);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_30,value,pCVar1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_40);
  AddCurrentError(this,kValidateErrorPattern,false);
  return;
}

Assistant:

void DoesNotMatch(const Ch* str, SizeType length) {
        currentError_.SetObject();
        currentError_.AddMember(GetActualString(), ValueType(str, length, GetStateAllocator()).Move(), GetStateAllocator());
        AddCurrentError(kValidateErrorPattern);
    }